

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_assert.h
# Opt level: O0

void TestEq<optional_scalars::OptionalByte,optional_scalars::OptionalByte>
               (OptionalByte expval,OptionalByte val,char *exp,char *file,int line,char *func)

{
  type tVar1;
  char *expval_00;
  char *val_00;
  string local_70;
  string local_50;
  char *local_30;
  char *func_local;
  char *pcStack_20;
  int line_local;
  char *file_local;
  char *exp_local;
  OptionalByte val_local;
  OptionalByte expval_local;
  
  if (expval != val) {
    local_30 = func;
    func_local._4_4_ = line;
    pcStack_20 = file;
    file_local = exp;
    exp_local._6_1_ = val;
    exp_local._7_1_ = expval;
    tVar1 = scalar_as_underlying<optional_scalars::OptionalByte>(expval);
    flatbuffers::NumToString<signed_char>(&local_50,tVar1);
    expval_00 = (char *)std::__cxx11::string::c_str();
    tVar1 = scalar_as_underlying<optional_scalars::OptionalByte>(exp_local._6_1_);
    flatbuffers::NumToString<signed_char>(&local_70,tVar1);
    val_00 = (char *)std::__cxx11::string::c_str();
    TestFail(expval_00,val_00,file_local,pcStack_20,func_local._4_4_,local_30);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void TestEq(T expval, U val, const char *exp, const char *file, int line,
            const char *func) {
  if (static_cast<U>(expval) != val) {
    TestFail(flatbuffers::NumToString(scalar_as_underlying(expval)).c_str(),
             flatbuffers::NumToString(scalar_as_underlying(val)).c_str(), exp,
             file, line, func);
  }
}